

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall
RPCResult::ToSections(RPCResult *this,Sections *sections,OuterType outer_type,int current_indent)

{
  pointer pRVar1;
  string_view func;
  string_view func_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  size_type sVar3;
  NonFatalCheckError *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  char *pcVar7;
  _Alloc_hider _Var8;
  RPCResult *i;
  pointer pRVar9;
  int current_indent_00;
  long in_FS_OFFSET;
  string_view msg;
  string_view msg_00;
  string_view file;
  string_view file_00;
  anon_class_8_1_8991fb9c Description;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string maybe_key;
  string maybe_separator;
  string indent_next;
  string indent;
  anon_class_8_1_8991fb9c local_1c0;
  string local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  Section local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  long *local_98;
  size_type local_90;
  long local_88 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_58,(long)current_indent,' ');
  current_indent_00 = current_indent + 2;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_78,(long)current_indent_00,' ');
  pcVar7 = "";
  if (outer_type != NONE) {
    pcVar7 = ",";
  }
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,pcVar7,pcVar7 + (outer_type != NONE));
  if (outer_type == OBJ) {
    std::operator+(&local_d8,"\"",&this->m_key_name);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_d8,"\" : ");
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_b8.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_b8._M_dataplus._M_p = (pointer)paVar5;
    }
    local_b8._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
  }
  if ((outer_type == OBJ) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2)) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_1c0.this = this;
  switch(this->m_type) {
  case OBJ:
  case OBJ_DYN:
    if ((this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::operator+(&local_158,&local_58,&local_b8);
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_158,"{");
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar2->_M_dataplus)._M_p;
      paVar4 = &pbVar2->field_2;
      if (paVar5 == paVar4) {
        local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      }
      else {
        local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_138._M_dataplus._M_p = (pointer)paVar5;
      }
      local_138._M_string_length = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"json object","");
      ToSections::anon_class_8_1_8991fb9c::operator()(&local_178,&local_1c0,&local_198);
      Section::Section(&local_118,&local_138,&local_178);
      sVar3 = local_118.m_left._M_string_length;
      if (local_118.m_left._M_string_length < sections->m_max_pad) {
        sVar3 = sections->m_max_pad;
      }
      sections->m_max_pad = sVar3;
      std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
      paVar5 = &local_118.m_right.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.m_right._M_dataplus._M_p != paVar5) {
        operator_delete(local_118.m_right._M_dataplus._M_p,
                        local_118.m_right.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                      local_118.m_left._M_dataplus._M_p._0_1_) != &local_118.m_left.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                                 local_118.m_left._M_dataplus._M_p._0_1_),
                        local_118.m_left.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      pRVar1 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pRVar9 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                    _M_impl.super__Vector_impl_data._M_start; pRVar9 != pRVar1; pRVar9 = pRVar9 + 1)
      {
        ToSections(pRVar9,sections,OBJ,current_indent_00);
      }
      if ((this->m_type == OBJ_DYN) &&
         ((this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].m_type != ELISION)) {
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,local_78._M_dataplus._M_p,
                   local_78._M_dataplus._M_p + local_78._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_138,"...");
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
        Section::Section(&local_118,&local_138,&local_158);
        sVar3 = local_118.m_left._M_string_length;
        if (local_118.m_left._M_string_length < sections->m_max_pad) {
          sVar3 = sections->m_max_pad;
        }
        sections->m_max_pad = sVar3;
        std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.m_right._M_dataplus._M_p != paVar5) {
          operator_delete(local_118.m_right._M_dataplus._M_p,
                          local_118.m_right.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                        local_118.m_left._M_dataplus._M_p._0_1_) != &local_118.m_left.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                                   local_118.m_left._M_dataplus._M_p._0_1_),
                          local_118.m_left.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                  (&(sections->m_sections).super__Vector_base<Section,_std::allocator<Section>_>.
                    _M_impl.super__Vector_impl_data._M_finish[-1].m_left);
      }
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,local_58._M_dataplus._M_p,
                 local_58._M_dataplus._M_p + local_58._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_158,"}");
      pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               _M_append(&local_158,(char *)local_98,local_90);
      local_138._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
      paVar4 = &pbVar2->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p == paVar4) {
        local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      }
      else {
        local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      }
      local_138._M_string_length = pbVar2->_M_string_length;
      (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar2->_M_string_length = 0;
      (pbVar2->field_2)._M_local_buf[0] = '\0';
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
      Section::Section(&local_118,&local_138,&local_178);
      if (local_118.m_left._M_string_length < sections->m_max_pad) {
        local_118.m_left._M_string_length = sections->m_max_pad;
      }
      sections->m_max_pad = local_118.m_left._M_string_length;
      std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.m_right._M_dataplus._M_p != paVar5) {
        operator_delete(local_118.m_right._M_dataplus._M_p,
                        local_118.m_right.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                      local_118.m_left._M_dataplus._M_p._0_1_) != &local_118.m_left.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                                 local_118.m_left._M_dataplus._M_p._0_1_),
                        local_118.m_left.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) goto LAB_00db453c;
      goto LAB_00db454c;
    }
    std::operator+(&local_158,&local_58,&local_b8);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_158,"{}");
    local_138._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
    paVar5 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == paVar5) {
      local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_138._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"empty JSON object","");
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_178,&local_1c0,&local_198);
    Section::Section(&local_118,&local_138,&local_178);
    if (local_118.m_left._M_string_length < sections->m_max_pad) {
      local_118.m_left._M_string_length = sections->m_max_pad;
    }
    sections->m_max_pad = local_118.m_left._M_string_length;
    std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.m_right._M_dataplus._M_p != &local_118.m_right.field_2) {
      operator_delete(local_118.m_right._M_dataplus._M_p,
                      local_118.m_right.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,local_118.m_left._M_dataplus._M_p._0_1_)
        != &local_118.m_left.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                               local_118.m_left._M_dataplus._M_p._0_1_),
                      local_118.m_left.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    local_178.field_2._M_allocated_capacity = local_158.field_2._M_allocated_capacity;
    _Var8._M_p = local_158._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) goto LAB_00db50e3;
    goto LAB_00db50eb;
  case ARR:
  case ARR_FIXED:
    std::operator+(&local_158,&local_58,&local_b8);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_158,"[");
    local_138._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
    paVar5 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == paVar5) {
      local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_138._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"json array","");
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_178,&local_1c0,&local_198);
    Section::Section(&local_118,&local_138,&local_178);
    sVar3 = local_118.m_left._M_string_length;
    if (local_118.m_left._M_string_length < sections->m_max_pad) {
      sVar3 = sections->m_max_pad;
    }
    sections->m_max_pad = sVar3;
    std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.m_right._M_dataplus._M_p != &local_118.m_right.field_2) {
      operator_delete(local_118.m_right._M_dataplus._M_p,
                      local_118.m_right.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,local_118.m_left._M_dataplus._M_p._0_1_)
        != &local_118.m_left.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                               local_118.m_left._M_dataplus._M_p._0_1_),
                      local_118.m_left.field_2._M_allocated_capacity + 1);
    }
    paVar5 = &local_178.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar5) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) {
      operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    pRVar1 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pRVar9 = (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                  super__Vector_impl_data._M_start; pRVar9 != pRVar1; pRVar9 = pRVar9 + 1) {
      ToSections(pRVar9,sections,ARR,current_indent_00);
    }
    local_118.m_left._M_dataplus._M_p._0_1_ =
         (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
         super__Vector_impl_data._M_start !=
         (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
         super__Vector_impl_data._M_finish;
    inline_check_non_fatal<bool>
              ((bool *)&local_118,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
               ,0x42a,"ToSections","!m_inner.empty()");
    paVar4 = &local_138.field_2;
    if ((this->m_type == ARR) &&
       ((this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].m_type != ELISION)) {
      local_138._M_dataplus._M_p = (pointer)paVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_78._M_dataplus._M_p,
                 local_78._M_dataplus._M_p + local_78._M_string_length);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_138,"...");
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
      Section::Section(&local_118,&local_138,&local_158);
      sVar3 = local_118.m_left._M_string_length;
      if (local_118.m_left._M_string_length < sections->m_max_pad) {
        sVar3 = sections->m_max_pad;
      }
      sections->m_max_pad = sVar3;
      std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118.m_right._M_dataplus._M_p != &local_118.m_right.field_2) {
        operator_delete(local_118.m_right._M_dataplus._M_p,
                        local_118.m_right.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                      local_118.m_left._M_dataplus._M_p._0_1_) != &local_118.m_left.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                                 local_118.m_left._M_dataplus._M_p._0_1_),
                        local_118.m_left.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar4) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&(sections->m_sections).super__Vector_base<Section,_std::allocator<Section>_>.
                  _M_impl.super__Vector_impl_data._M_finish[-1].m_left);
    }
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_158,"]");
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_158,(char *)local_98,local_90);
    local_138._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
    paVar6 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == paVar6) {
      local_138.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_138._M_dataplus._M_p = (pointer)paVar4;
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    local_138._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    local_178._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
    Section::Section(&local_118,&local_138,&local_178);
    if (local_118.m_left._M_string_length < sections->m_max_pad) {
      local_118.m_left._M_string_length = sections->m_max_pad;
    }
    sections->m_max_pad = local_118.m_left._M_string_length;
    std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.m_right._M_dataplus._M_p != &local_118.m_right.field_2) {
      operator_delete(local_118.m_right._M_dataplus._M_p,
                      local_118.m_right.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,local_118.m_left._M_dataplus._M_p._0_1_)
        != &local_118.m_left.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                               local_118.m_left._M_dataplus._M_p._0_1_),
                      local_118.m_left.field_2._M_allocated_capacity + 1);
    }
    local_198.field_2._M_allocated_capacity = local_178.field_2._M_allocated_capacity;
    _Var8._M_p = local_178._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar5) {
LAB_00db49b5:
      operator_delete(_Var8._M_p,local_198.field_2._M_allocated_capacity + 1);
    }
    goto LAB_00db49bd;
  case STR:
    std::operator+(&local_178,&local_58,&local_b8);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_178,"\"str\"");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158._M_dataplus._M_p = (pointer)paVar5;
    }
    local_158._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_158,(char *)local_98,local_90);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138._M_dataplus._M_p = (pointer)paVar5;
    }
    local_138._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"string","");
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_198,&local_1c0,&local_1b8);
    Section::Section(&local_118,&local_138,&local_198);
    if (local_118.m_left._M_string_length < sections->m_max_pad) {
      local_118.m_left._M_string_length = sections->m_max_pad;
    }
    sections->m_max_pad = local_118.m_left._M_string_length;
    std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
    break;
  case NUM:
    std::operator+(&local_178,&local_58,&local_b8);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_178,"n");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158._M_dataplus._M_p = (pointer)paVar5;
    }
    local_158._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_158,(char *)local_98,local_90);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138._M_dataplus._M_p = (pointer)paVar5;
    }
    local_138._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"numeric","");
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_198,&local_1c0,&local_1b8);
    Section::Section(&local_118,&local_138,&local_198);
    if (local_118.m_left._M_string_length < sections->m_max_pad) {
      local_118.m_left._M_string_length = sections->m_max_pad;
    }
    sections->m_max_pad = local_118.m_left._M_string_length;
    std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
    break;
  case BOOL:
    std::operator+(&local_178,&local_58,&local_b8);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_178,"true|false");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158._M_dataplus._M_p = (pointer)paVar5;
    }
    local_158._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_158,(char *)local_98,local_90);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138._M_dataplus._M_p = (pointer)paVar5;
    }
    local_138._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"boolean","");
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_198,&local_1c0,&local_1b8);
    Section::Section(&local_118,&local_138,&local_198);
    if (local_118.m_left._M_string_length < sections->m_max_pad) {
      local_118.m_left._M_string_length = sections->m_max_pad;
    }
    sections->m_max_pad = local_118.m_left._M_string_length;
    std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
    break;
  case NONE:
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_158,"null");
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_158,(char *)local_98,local_90);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138._M_dataplus._M_p = (pointer)paVar5;
    }
    local_138._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"json null","");
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_178,&local_1c0,&local_198);
    Section::Section(&local_118,&local_138,&local_178);
    if (local_118.m_left._M_string_length < sections->m_max_pad) {
      local_118.m_left._M_string_length = sections->m_max_pad;
    }
    sections->m_max_pad = local_118.m_left._M_string_length;
    std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.m_right._M_dataplus._M_p != &local_118.m_right.field_2) {
      operator_delete(local_118.m_right._M_dataplus._M_p,
                      local_118.m_right.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,local_118.m_left._M_dataplus._M_p._0_1_)
        != &local_118.m_left.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                               local_118.m_left._M_dataplus._M_p._0_1_),
                      local_118.m_left.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
    _Var8._M_p = local_198._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_dataplus._M_p != &local_198.field_2) goto LAB_00db49b5;
LAB_00db49bd:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    local_178.field_2._M_allocated_capacity = local_158.field_2._M_allocated_capacity;
    _Var8._M_p = local_158._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) goto LAB_00db50e3;
    goto LAB_00db50eb;
  case ANY:
    this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
    func_00._M_str = "ToSections";
    func_00._M_len = 10;
    msg_00._M_str = "Unreachable code reached (non-fatal)";
    msg_00._M_len = 0x24;
    file_00._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp";
    file_00._M_len = 0x55;
    NonFatalCheckError::NonFatalCheckError(this_00,msg_00,file_00,0x406,func_00);
    goto LAB_00db5248;
  case STR_AMOUNT:
    std::operator+(&local_178,&local_58,&local_b8);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_178,"n");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158._M_dataplus._M_p = (pointer)paVar5;
    }
    local_158._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_158,(char *)local_98,local_90);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138._M_dataplus._M_p = (pointer)paVar5;
    }
    local_138._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"numeric","");
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_198,&local_1c0,&local_1b8);
    Section::Section(&local_118,&local_138,&local_198);
    if (local_118.m_left._M_string_length < sections->m_max_pad) {
      local_118.m_left._M_string_length = sections->m_max_pad;
    }
    sections->m_max_pad = local_118.m_left._M_string_length;
    std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
    break;
  case STR_HEX:
    std::operator+(&local_178,&local_58,&local_b8);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_178,"\"hex\"");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158._M_dataplus._M_p = (pointer)paVar5;
    }
    local_158._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_158,(char *)local_98,local_90);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138._M_dataplus._M_p = (pointer)paVar5;
    }
    local_138._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"string","");
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_198,&local_1c0,&local_1b8);
    Section::Section(&local_118,&local_138,&local_198);
    if (local_118.m_left._M_string_length < sections->m_max_pad) {
      local_118.m_left._M_string_length = sections->m_max_pad;
    }
    sections->m_max_pad = local_118.m_left._M_string_length;
    std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
    break;
  case NUM_TIME:
    std::operator+(&local_178,&local_58,&local_b8);
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_178,"xxx");
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_158.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_158._M_dataplus._M_p = (pointer)paVar5;
    }
    local_158._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_158,(char *)local_98,local_90);
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(pbVar2->_M_dataplus)._M_p;
    paVar4 = &pbVar2->field_2;
    if (paVar5 == paVar4) {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
      local_138._M_dataplus._M_p = (pointer)paVar5;
    }
    local_138._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"numeric","");
    ToSections::anon_class_8_1_8991fb9c::operator()(&local_198,&local_1c0,&local_1b8);
    Section::Section(&local_118,&local_138,&local_198);
    if (local_118.m_left._M_string_length < sections->m_max_pad) {
      local_118.m_left._M_string_length = sections->m_max_pad;
    }
    sections->m_max_pad = local_118.m_left._M_string_length;
    std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
    break;
  case ELISION:
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&local_158,"...");
    pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_158,(char *)local_98,local_90);
    local_138._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
    paVar5 = &pbVar2->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == paVar5) {
      local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_138.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_138._M_string_length = pbVar2->_M_string_length;
    (pbVar2->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar2->_M_string_length = 0;
    (pbVar2->field_2)._M_local_buf[0] = '\0';
    Section::Section(&local_118,&local_138,&this->m_description);
    if (local_118.m_left._M_string_length < sections->m_max_pad) {
      local_118.m_left._M_string_length = sections->m_max_pad;
    }
    sections->m_max_pad = local_118.m_left._M_string_length;
    std::vector<Section,_std::allocator<Section>_>::push_back(&sections->m_sections,&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.m_right._M_dataplus._M_p != &local_118.m_right.field_2) {
      operator_delete(local_118.m_right._M_dataplus._M_p,
                      local_118.m_right.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,local_118.m_left._M_dataplus._M_p._0_1_)
        != &local_118.m_left.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                               local_118.m_left._M_dataplus._M_p._0_1_),
                      local_118.m_left.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
LAB_00db453c:
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
LAB_00db454c:
    local_178.field_2._M_allocated_capacity = local_158.field_2._M_allocated_capacity;
    _Var8._M_p = local_158._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p == &local_158.field_2) goto LAB_00db50eb;
    goto LAB_00db50e3;
  default:
    this_00 = (NonFatalCheckError *)__cxa_allocate_exception(0x10);
    func._M_str = "ToSections";
    func._M_len = 10;
    msg._M_str = "Unreachable code reached (non-fatal)";
    msg._M_len = 0x24;
    file._M_str = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp";
    file._M_len = 0x55;
    NonFatalCheckError::NonFatalCheckError(this_00,msg,file,0x449,func);
LAB_00db5248:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_00,&NonFatalCheckError::typeinfo,std::runtime_error::~runtime_error);
    }
    goto LAB_00db5a94;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118.m_right._M_dataplus._M_p != &local_118.m_right.field_2) {
    operator_delete(local_118.m_right._M_dataplus._M_p,
                    local_118.m_right.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,local_118.m_left._M_dataplus._M_p._0_1_)
      != &local_118.m_left.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_118.m_left._M_dataplus._M_p._1_7_,
                             local_118.m_left._M_dataplus._M_p._0_1_),
                    local_118.m_left.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  _Var8._M_p = local_178._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
LAB_00db50e3:
    operator_delete(_Var8._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
LAB_00db50eb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00db5a94:
  __stack_chk_fail();
}

Assistant:

void RPCResult::ToSections(Sections& sections, const OuterType outer_type, const int current_indent) const
{
    // Indentation
    const std::string indent(current_indent, ' ');
    const std::string indent_next(current_indent + 2, ' ');

    // Elements in a JSON structure (dictionary or array) are separated by a comma
    const std::string maybe_separator{outer_type != OuterType::NONE ? "," : ""};

    // The key name if recursed into a dictionary
    const std::string maybe_key{
        outer_type == OuterType::OBJ ?
            "\"" + this->m_key_name + "\" : " :
            ""};

    // Format description with type
    const auto Description = [&](const std::string& type) {
        return "(" + type + (this->m_optional ? ", optional" : "") + ")" +
               (this->m_description.empty() ? "" : " " + this->m_description);
    };

    switch (m_type) {
    case Type::ELISION: {
        // If the inner result is empty, use three dots for elision
        sections.PushSection({indent + "..." + maybe_separator, m_description});
        return;
    }
    case Type::ANY: {
        NONFATAL_UNREACHABLE(); // Only for testing
    }
    case Type::NONE: {
        sections.PushSection({indent + "null" + maybe_separator, Description("json null")});
        return;
    }
    case Type::STR: {
        sections.PushSection({indent + maybe_key + "\"str\"" + maybe_separator, Description("string")});
        return;
    }
    case Type::STR_AMOUNT: {
        sections.PushSection({indent + maybe_key + "n" + maybe_separator, Description("numeric")});
        return;
    }
    case Type::STR_HEX: {
        sections.PushSection({indent + maybe_key + "\"hex\"" + maybe_separator, Description("string")});
        return;
    }
    case Type::NUM: {
        sections.PushSection({indent + maybe_key + "n" + maybe_separator, Description("numeric")});
        return;
    }
    case Type::NUM_TIME: {
        sections.PushSection({indent + maybe_key + "xxx" + maybe_separator, Description("numeric")});
        return;
    }
    case Type::BOOL: {
        sections.PushSection({indent + maybe_key + "true|false" + maybe_separator, Description("boolean")});
        return;
    }
    case Type::ARR_FIXED:
    case Type::ARR: {
        sections.PushSection({indent + maybe_key + "[", Description("json array")});
        for (const auto& i : m_inner) {
            i.ToSections(sections, OuterType::ARR, current_indent + 2);
        }
        CHECK_NONFATAL(!m_inner.empty());
        if (m_type == Type::ARR && m_inner.back().m_type != Type::ELISION) {
            sections.PushSection({indent_next + "...", ""});
        } else {
            // Remove final comma, which would be invalid JSON
            sections.m_sections.back().m_left.pop_back();
        }
        sections.PushSection({indent + "]" + maybe_separator, ""});
        return;
    }
    case Type::OBJ_DYN:
    case Type::OBJ: {
        if (m_inner.empty()) {
            sections.PushSection({indent + maybe_key + "{}", Description("empty JSON object")});
            return;
        }
        sections.PushSection({indent + maybe_key + "{", Description("json object")});
        for (const auto& i : m_inner) {
            i.ToSections(sections, OuterType::OBJ, current_indent + 2);
        }
        if (m_type == Type::OBJ_DYN && m_inner.back().m_type != Type::ELISION) {
            // If the dictionary keys are dynamic, use three dots for continuation
            sections.PushSection({indent_next + "...", ""});
        } else {
            // Remove final comma, which would be invalid JSON
            sections.m_sections.back().m_left.pop_back();
        }
        sections.PushSection({indent + "}" + maybe_separator, ""});
        return;
    }
    } // no default case, so the compiler can warn about missing cases
    NONFATAL_UNREACHABLE();
}